

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# box.cpp
# Opt level: O2

void __thiscall tli_window_manager::Box::Box(Box *this,Box *other)

{
  int iVar1;
  
  this->_vptr_Box = (_func_int **)&PTR___cxa_pure_virtual_00109b18;
  iVar1 = other->width_;
  other->width_ = 0;
  this->width_ = iVar1;
  iVar1 = other->height_;
  other->height_ = 0;
  this->height_ = iVar1;
  return;
}

Assistant:

Box::Box(Box &&other) noexcept:
        width_{std::exchange(other.width_, 0)}, height_{std::exchange(other.height_, 0)} {}